

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

State * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
PushUnsafe<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  State *pSVar1;
  State *ret;
  size_t count_local;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  if (this->stackTop_ == (char *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x82,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::State]"
                 );
  }
  if ((long)(count * 0x10) <= (long)this->stackEnd_ - (long)this->stackTop_) {
    pSVar1 = (State *)this->stackTop_;
    this->stackTop_ = this->stackTop_ + count * 0x10;
    return pSVar1;
  }
  __assert_fail("static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x83,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::State]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_));
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }